

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O1

aom_codec_err_t ctrl_set_active_map(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  undefined8 *puVar2;
  int iVar3;
  long *plVar4;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    plVar4 = (long *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    plVar4 = (long *)args->overflow_arg_area;
    args->overflow_arg_area = plVar4 + 1;
  }
  puVar2 = (undefined8 *)*plVar4;
  if (puVar2 != (undefined8 *)0x0) {
    iVar3 = av1_set_active_map(ctx->ppi->cpi,(uchar *)*puVar2,*(int *)(puVar2 + 1),
                               *(int *)((long)puVar2 + 0xc));
    return (uint)(iVar3 != 0) << 3;
  }
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

static aom_codec_err_t ctrl_set_active_map(aom_codec_alg_priv_t *ctx,
                                           va_list args) {
  aom_active_map_t *const map = va_arg(args, aom_active_map_t *);

  if (map) {
    if (!av1_set_active_map(ctx->ppi->cpi, map->active_map, (int)map->rows,
                            (int)map->cols))
      return AOM_CODEC_OK;
    else
      return AOM_CODEC_INVALID_PARAM;
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}